

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree.c
# Opt level: O2

ion_bpp_err_t
b_find_first_greater_or_equal
          (ion_bpp_handle_t handle,void *key,void *mkey,ion_bpp_external_address_t *rec)

{
  ion_bpp_node_t *piVar1;
  ion_bpp_node_t iVar2;
  ion_bpp_buffer_t *piVar3;
  int iVar4;
  ion_bpp_err_t iVar5;
  ion_bpp_key_t *__src;
  ion_bpp_address_t adr;
  ion_bpp_buffer_t *buf;
  void *local_48;
  ion_bpp_external_address_t *local_40;
  ion_bpp_key_t *local_38;
  
  buf = (ion_bpp_buffer_t *)((long)handle + 0x20);
  local_48 = mkey;
  local_40 = rec;
  do {
    piVar3 = buf;
    iVar2 = *buf->p;
    iVar4 = search(handle,buf,key,0,&local_38,MODE_LLEQ);
    if ((undefined1  [40])((undefined1  [40])iVar2 & (undefined1  [40])0x1) != (undefined1  [40])0x0
       ) {
      __src = local_38;
      if (0 < iVar4) {
        piVar1 = piVar3->p;
        if ((long)(local_38 + (-0x20 - (long)piVar1)) / (long)*(int *)((long)handle + 0xbc) ==
            (ulong)(*(ushort *)piVar1 >> 1)) {
          return bErrKeyNotFound;
        }
        __src = local_38 + *(int *)((long)handle + 0xbc);
      }
      *(ion_bpp_buffer_t **)((long)handle + 0xa8) = piVar3;
      *(ion_bpp_key_t **)((long)handle + 0xb0) = __src;
      memcpy(local_48,__src,(long)*(int *)((long)handle + 8));
      *local_40 = *(ion_bpp_external_address_t *)(__src + *(int *)((long)handle + 8));
      return bErrOk;
    }
    if (iVar4 < 0) {
      adr = *(ion_bpp_address_t *)(local_38 + -8);
    }
    else {
      adr = *(ion_bpp_address_t *)(local_38 + (long)*(int *)((long)handle + 8) + 8);
    }
    iVar5 = readDisk(handle,adr,&buf);
  } while (iVar5 == bErrOk);
  return iVar5;
}

Assistant:

ion_bpp_err_t
b_find_first_greater_or_equal(
	ion_bpp_handle_t			handle,
	void						*key,
	void						*mkey,
	ion_bpp_external_address_t	*rec
) {
	ion_bpp_key_t		*lgeqkey;			/* matched key */
	ion_bpp_buffer_t	*buf;				/* buffer */
	ion_bpp_err_t		rc;			/* return code */
	int					cc;

	ion_bpp_h_node_t *h = handle;

	buf = &h->root;

	/* find key, and return address */
	while (1) {
		if (leaf(buf)) {
			if ((cc = search(handle, buf, key, 0, &lgeqkey, MODE_LLEQ)) > 0) {
				if ((lgeqkey - fkey(buf)) / (h->ks) == (ct(buf))) {
					return bErrKeyNotFound;
				}

				lgeqkey += ks(1);
			}

			h->curBuf	= buf;
			h->curKey	= lgeqkey;
			memcpy(mkey, key(lgeqkey), h->keySize);
			*rec		= rec(lgeqkey);

			return bErrOk;
		}
		else {
			cc = search(handle, buf, key, 0, &lgeqkey, MODE_LLEQ);

			if (cc < 0) {
				if ((rc = readDisk(handle, childLT(lgeqkey), &buf)) != 0) {
					return rc;
				}
			}
			else {
				if ((rc = readDisk(handle, childGE(lgeqkey), &buf)) != 0) {
					return rc;
				}
			}
		}
	}
}